

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O0

void __thiscall
JsonArray_BeginArrayReturnsError_Test::TestBody(JsonArray_BeginArrayReturnsError_Test *this)

{
  bool bVar1;
  MockSpec<std::error_code_()> *this_00;
  TypedExpectation<std::error_code_()> *this_01;
  error_code *lhs;
  char *pcVar2;
  extensions extensions;
  mock_json_callbacks *in_RSI;
  error_code eVar3;
  AssertHelper local_198;
  Message local_190;
  coord local_188;
  coord local_180;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_1;
  Message local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar;
  undefined1 local_128 [8];
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  ReturnAction<std::error_code> local_68;
  Action<std::error_code_()> local_58;
  WithoutMatchers local_31;
  MockSpec<std::error_code_()> local_30;
  undefined1 auStack_20 [8];
  error_code error;
  JsonArray_BeginArrayReturnsError_Test *this_local;
  
  error._M_cat = (error_category *)this;
  eVar3 = std::make_error_code(io_error);
  error._0_8_ = eVar3._M_cat;
  auStack_20._0_4_ = eVar3._M_value;
  local_30.function_mocker_ =
       (FunctionMocker<std::error_code_()> *)
       mock_json_callbacks::gmock_begin_array
                 ((MockSpec<std::error_code_()> *)&(this->super_JsonArray).callbacks_,in_RSI);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<std::error_code_()>::operator()
                      (&local_30,&local_31,(void *)0x0);
  extensions = 0x1effd7;
  this_01 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
                       ,0x37,"callbacks_","begin_array ()");
  eVar3._M_cat._0_4_ = auStack_20._0_4_;
  eVar3._0_8_ = (ReturnAction *)&local_68;
  eVar3._M_cat._4_4_ = 0;
  testing::Return<std::error_code>(eVar3);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_58,(ReturnAction *)&local_68);
  testing::internal::TypedExpectation<std::error_code_()>::WillOnce(this_01,&local_58);
  testing::Action<std::error_code_()>::~Action(&local_58);
  testing::internal::ReturnAction<std::error_code>::~ReturnAction(&local_68);
  pstore::json::make_parser<callbacks_proxy<mock_json_callbacks>>
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_128,
             (json *)&(this->super_JsonArray).proxy_,(callbacks_proxy<mock_json_callbacks> *)0x0,
             extensions);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &gtest_ar.message_,"[\n]\n",4);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::input
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_128,(string *)&gtest_ar.message_
            );
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  lhs = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::last_error
                  ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_128);
  testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
            ((EqHelper *)local_158,"p.last_error ()","error",lhs,(error_code *)auStack_20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  local_180 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::coordinate
                        ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_128);
  pstore::json::coord::coord(&local_188,1,1);
  testing::internal::EqHelper::Compare<pstore::json::coord,_pstore::json::coord,_nullptr>
            ((EqHelper *)local_178,"p.coordinate ()","(json::coord{1U, 1U})",&local_180,&local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_198,&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::~parser
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_128);
  return;
}

Assistant:

TEST_F (JsonArray, BeginArrayReturnsError) {
    std::error_code const error = make_error_code (std::errc::io_error);
    using ::testing::Return;
    EXPECT_CALL (callbacks_, begin_array ()).WillOnce (Return (error));

    auto p = json::make_parser (proxy_);
    p.input ("[\n]\n"s);
    EXPECT_EQ (p.last_error (), error);
    EXPECT_EQ (p.coordinate (), (json::coord{1U, 1U}));
}